

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

void __thiscall converter::rmp(converter *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer __y;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  _Self local_20;
  _Self local_18;
  iterator it;
  converter *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin(&this->commandmp);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->commandmp);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_18);
    __y = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::operator->(&local_18);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<int_&,_true>(&local_48,&ppVar2->second,&__y->first);
    std::
    map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::insert<std::pair<int,std::__cxx11::string>>
              ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                *)&this->rcommandmp,&local_48);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_48);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_18,0);
  }
  return;
}

Assistant:

void converter::rmp(){
    for(auto it=commandmp.begin();it!=commandmp.end();it++)
        rcommandmp.insert(std::pair<int,std::string>(it->second,it->first)); 
}